

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_histogram.cpp
# Opt level: O3

void Omega_h::print_goal_stats
               (Mesh *mesh,char *name,Int ent_dim,Reals *values,MinMax<double> desired,
               MinMax<double> actual)

{
  int *piVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  Alloc *pAVar5;
  I32 IVar6;
  GO GVar7;
  GO GVar8;
  GO GVar9;
  ostream *poVar10;
  char *pcVar11;
  size_t sVar12;
  double b;
  double b_00;
  fmtflags __old;
  Bytes high_marks;
  Bytes low_marks;
  char local_c0;
  undefined7 uStack_bf;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  Read<signed_char> local_b0;
  Read<signed_char> local_a0;
  Read<double> local_90;
  Alloc *local_80;
  void *local_78;
  Read<double> local_70;
  Alloc *local_60;
  void *local_58;
  undefined8 local_50;
  char *local_48;
  double local_40;
  double local_38;
  
  local_40 = actual.max;
  local_38 = actual.min;
  b_00 = desired.max;
  b = desired.min;
  local_70.write_.shared_alloc_.alloc = (values->write_).shared_alloc_.alloc;
  if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70.write_.shared_alloc_.alloc =
           (Alloc *)((local_70.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_70.write_.shared_alloc_.alloc)->use_count =
           (local_70.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_70.write_.shared_alloc_.direct_ptr = (values->write_).shared_alloc_.direct_ptr;
  each_lt<double>((Omega_h *)&local_60,&local_70,b);
  pAVar5 = local_70.write_.shared_alloc_.alloc;
  if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_70.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  local_90.write_.shared_alloc_.alloc = (values->write_).shared_alloc_.alloc;
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90.write_.shared_alloc_.alloc =
           (Alloc *)((local_90.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_90.write_.shared_alloc_.alloc)->use_count =
           (local_90.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_90.write_.shared_alloc_.direct_ptr = (values->write_).shared_alloc_.direct_ptr;
  each_gt<double>((Omega_h *)&local_80,&local_90,b_00);
  pAVar5 = local_90.write_.shared_alloc_.alloc;
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_90.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  local_a0.write_.shared_alloc_.alloc = local_60;
  if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0.write_.shared_alloc_.alloc = (Alloc *)(local_60->size * 8 + 1);
    }
    else {
      local_60->use_count = local_60->use_count + 1;
    }
  }
  local_a0.write_.shared_alloc_.direct_ptr = local_58;
  local_48 = name;
  GVar7 = count_owned_marks(mesh,ent_dim,&local_a0);
  pAVar5 = local_a0.write_.shared_alloc_.alloc;
  if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_a0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a0.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  local_b0.write_.shared_alloc_.alloc = local_80;
  if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0.write_.shared_alloc_.alloc = (Alloc *)(local_80->size * 8 + 1);
    }
    else {
      local_80->use_count = local_80->use_count + 1;
    }
  }
  local_b0.write_.shared_alloc_.direct_ptr = local_78;
  GVar8 = count_owned_marks(mesh,ent_dim,&local_b0);
  pAVar5 = local_b0.write_.shared_alloc_.alloc;
  if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_b0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_b0.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  GVar9 = Mesh::nglobal_ents(mesh,ent_dim);
  Mesh::comm(mesh);
  IVar6 = Comm::rank((Comm *)CONCAT71(uStack_bf,local_c0));
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  lVar4 = std::cout;
  if (IVar6 == 0) {
    lVar3 = *(long *)(std::cout + -0x18);
    local_50 = *(undefined8 *)(operator_delete__ + lVar3);
    uVar2 = *(uint *)(std::__cxx11::string::compare + lVar3);
    *(uint *)(std::__cxx11::string::compare + lVar3) = uVar2 & 0xfffffefb | 4;
    *(undefined8 *)(operator_delete__ + *(long *)(lVar4 + -0x18)) = 2;
    poVar10 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    pcVar11 = topological_plural_name(mesh->family_,ent_dim);
    if (pcVar11 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
    }
    else {
      sVar12 = strlen(pcVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar11,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    pcVar11 = local_48;
    if (local_48 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x4c3378);
    }
    else {
      sVar12 = strlen(local_48);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [",2);
    poVar10 = std::ostream::_M_insert<double>(local_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
    poVar10 = std::ostream::_M_insert<double>(local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
    if (GVar7 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
      poVar10 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," <",2);
      std::ostream::_M_insert<double>(b);
    }
    if (GVar9 != GVar7 + GVar8) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
      poVar10 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," in [",5);
      poVar10 = std::ostream::_M_insert<double>(b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
      poVar10 = std::ostream::_M_insert<double>(b_00);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
    }
    if (GVar8 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
      poVar10 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," >",2);
      std::ostream::_M_insert<double>(b_00);
    }
    local_c0 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_c0,1);
    lVar4 = std::cout;
    *(uint *)(std::__cxx11::string::compare + *(long *)(std::cout + -0x18)) = uVar2;
    *(undefined8 *)(operator_delete__ + *(long *)(lVar4 + -0x18)) = local_50;
  }
  if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
    piVar1 = &local_80->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_80);
      operator_delete(local_80,0x48);
    }
  }
  if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
    piVar1 = &local_60->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60);
      operator_delete(local_60,0x48);
    }
  }
  return;
}

Assistant:

void print_goal_stats(Mesh* mesh, char const* name, Int ent_dim, Reals values,
    MinMax<Real> desired, MinMax<Real> actual) {
  auto low_marks = each_lt(values, desired.min);
  auto high_marks = each_gt(values, desired.max);
  auto nlow = count_owned_marks(mesh, ent_dim, low_marks);
  auto nhigh = count_owned_marks(mesh, ent_dim, high_marks);
  auto ntotal = mesh->nglobal_ents(ent_dim);
  auto nmid = ntotal - nlow - nhigh;
  if (mesh->comm()->rank() == 0) {
    auto precision_before = std::cout.precision();
    std::ios::fmtflags stream_state(std::cout.flags());
    std::cout << std::fixed << std::setprecision(2);
    std::cout << ntotal << " "
              << topological_plural_name(mesh->family(), ent_dim);
    std::cout << ", " << name << " [" << actual.min << "," << actual.max << "]";
    if (nlow) {
      std::cout << ", " << nlow << " <" << desired.min;
    }
    if (nmid) {
      std::cout << ", " << nmid << " in [" << desired.min << "," << desired.max
                << "]";
    }
    if (nhigh) {
      std::cout << ", " << nhigh << " >" << desired.max;
    }
    std::cout << '\n';
    std::cout.flags(stream_state);
    std::cout.precision(precision_before);
  }
}